

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O1

shared_ptr<Buffer> __thiscall
qpdf::Stream::getStreamData(Stream *this,qpdf_stream_decode_level_e decode_level)

{
  qpdf_offset_t offset;
  QPDFExc *this_00;
  qpdf_stream_decode_level_e in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Stream *this_01;
  shared_ptr<Buffer> sVar1;
  bool filtered;
  Pl_Buffer buf;
  bool local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  Pl_Buffer local_60;
  
  this_01 = (Stream *)CONCAT44(in_register_00000034,decode_level);
  Pl_Buffer::Pl_Buffer(&local_60,"stream data buffer",(Pipeline *)0x0);
  pipeStreamData(this_01,&local_60.super_Pipeline,&local_c1,0,in_EDX,false,false);
  if (local_c1 != false) {
    Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)this);
    Pl_Buffer::~Pl_Buffer(&local_60);
    sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<Buffer>)sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  QPDF::getFilename_abi_cxx11_
            (&local_80,
             ((this_01->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qpdf);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  offset = ((this_01->super_BaseHandle).obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parsed_offset;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"getStreamData called on unfilterable stream","");
  QPDFExc::QPDFExc(this_00,qpdf_e_unsupported,&local_80,&local_a0,offset,&local_c0);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

std::shared_ptr<Buffer>
Stream::getStreamData(qpdf_stream_decode_level_e decode_level)
{
    Pl_Buffer buf("stream data buffer");
    bool filtered;
    pipeStreamData(&buf, &filtered, 0, decode_level, false, false);
    if (!filtered) {
        throw QPDFExc(
            qpdf_e_unsupported,
            obj->getQPDF()->getFilename(),
            "",
            obj->getParsedOffset(),
            "getStreamData called on unfilterable stream");
    }
    QTC::TC("qpdf", "QPDF_Stream getStreamData");
    return buf.getBufferSharedPointer();
}